

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::AdjacencyInfo::AllocateNumNeighborsArray(AdjacencyInfo *this,long numElements)

{
  long *plVar1;
  
  if (this->m_numNeighborsSize < numElements) {
    if (this->m_numNeighbors != (long *)0x0) {
      operator_delete__(this->m_numNeighbors);
    }
    this->m_numNeighborsSize = numElements;
    plVar1 = (long *)operator_new__(-(ulong)((ulong)numElements >> 0x3d != 0) | numElements * 8);
    this->m_numNeighbors = plVar1;
  }
  this->m_numElements = numElements;
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode          AllocateNumNeighborsArray(long numElements)
                                {
                                    if (numElements > m_numNeighborsSize)
                                    {
                                        delete [] m_numNeighbors;
                                        m_numNeighborsSize = numElements;
                                        m_numNeighbors = new long [m_numNeighborsSize];
                                    }
                                    m_numElements = numElements;
                                    return O3DGC_OK;
                                }